

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O0

uint32_t leveldb::Hash(char *data,size_t n,uint32_t seed)

{
  uint32_t uVar1;
  uint uVar2;
  long lVar3;
  uint local_34;
  uint32_t w;
  uint32_t h;
  char *limit;
  uint32_t r;
  uint32_t m;
  uint32_t seed_local;
  size_t n_local;
  char *data_local;
  
  local_34 = seed ^ (int)n * -0x395b586d;
  for (n_local = (size_t)data; (char *)(n_local + 4) <= data + n; n_local = n_local + 4) {
    uVar1 = DecodeFixed32((char *)n_local);
    local_34 = (uVar1 + local_34) * -0x395b586d;
    local_34 = local_34 >> 0x10 ^ local_34;
  }
  lVar3 = (long)(data + n) - n_local;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      if (lVar3 != 3) {
        return local_34;
      }
      local_34 = (uint)*(byte *)(n_local + 2) * 0x10000 + local_34;
    }
    local_34 = (uint)*(byte *)(n_local + 1) * 0x100 + local_34;
  }
  uVar2 = (*(byte *)n_local + local_34) * -0x395b586d;
  return uVar2 >> 0x18 ^ uVar2;
}

Assistant:

uint32_t Hash(const char* data, size_t n, uint32_t seed) {
  // Similar to murmur hash
  const uint32_t m = 0xc6a4a793;
  const uint32_t r = 24;
  const char* limit = data + n;
  uint32_t h = seed ^ (n * m);

  // Pick up four bytes at a time
  while (data + 4 <= limit) {
    uint32_t w = DecodeFixed32(data);
    data += 4;
    h += w;
    h *= m;
    h ^= (h >> 16);
  }

  // Pick up remaining bytes
  switch (limit - data) {
    case 3:
      h += static_cast<uint8_t>(data[2]) << 16;
      FALLTHROUGH_INTENDED;
    case 2:
      h += static_cast<uint8_t>(data[1]) << 8;
      FALLTHROUGH_INTENDED;
    case 1:
      h += static_cast<uint8_t>(data[0]);
      h *= m;
      h ^= (h >> r);
      break;
  }
  return h;
}